

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *
duckdb::SplitQueryStringIntoStatements(string *query)

{
  ulong uVar1;
  size_type sVar2;
  long lVar3;
  ulong in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_RDI;
  idx_t c;
  value_type *t;
  value_type *t_prev;
  idx_t i;
  idx_t next_statement_start;
  vector<duckdb::SimplifiedToken,_true> tokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *query_statements;
  size_type in_stack_ffffffffffffff18;
  vector<duckdb::SimplifiedToken,_true> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  reference in_stack_ffffffffffffff30;
  string asStack_a8 [32];
  string asStack_88 [32];
  ulong uStack_68;
  reference pvStack_60;
  reference pvStack_58;
  ulong uStack_50;
  idx_t iStack_48;
  string *in_stack_ffffffffffffffd8;
  
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)0x2a17221);
  Parser::Tokenize(in_stack_ffffffffffffffd8);
  iStack_48 = 0;
  for (uStack_50 = 1; uVar1 = uStack_50,
      sVar2 = ::std::vector<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>::size
                        ((vector<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>
                          *)&stack0xffffffffffffffd0), uVar1 < sVar2; uStack_50 = uStack_50 + 1) {
    pvStack_58 = vector<duckdb::SimplifiedToken,_true>::operator[]
                           (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff30 =
         vector<duckdb::SimplifiedToken,_true>::operator[]
                   (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    pvStack_60 = in_stack_ffffffffffffff30;
    if (pvStack_58->type == SIMPLIFIED_TOKEN_OPERATOR) {
      for (uStack_68 = pvStack_58->start; uStack_68 <= pvStack_60->start; uStack_68 = uStack_68 + 1)
      {
        lVar3 = ::std::__cxx11::string::c_str();
        if (*(char *)(lVar3 + uStack_68) == ';') {
          ::std::__cxx11::string::substr((ulong)asStack_88,in_RSI);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::
          emplace_back<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
          ::std::__cxx11::string::~string(asStack_88);
          in_stack_ffffffffffffff28 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               vector<duckdb::SimplifiedToken,_true>::operator[]
                         (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
          iStack_48 = in_stack_ffffffffffffff28->_M_string_length;
        }
      }
    }
  }
  ::std::__cxx11::string::size();
  ::std::__cxx11::string::substr((ulong)asStack_a8,in_RSI);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::emplace_back<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  ::std::__cxx11::string::~string(asStack_a8);
  vector<duckdb::SimplifiedToken,_true>::~vector((vector<duckdb::SimplifiedToken,_true> *)0x2a174a4)
  ;
  return in_RDI;
}

Assistant:

vector<string> SplitQueryStringIntoStatements(const string &query) {
	// Break sql string down into sql statements using the tokenizer
	vector<string> query_statements;
	auto tokens = Parser::Tokenize(query);
	idx_t next_statement_start = 0;
	for (idx_t i = 1; i < tokens.size(); ++i) {
		auto &t_prev = tokens[i - 1];
		auto &t = tokens[i];
		if (t_prev.type == SimplifiedTokenType::SIMPLIFIED_TOKEN_OPERATOR) {
			// LCOV_EXCL_START
			for (idx_t c = t_prev.start; c <= t.start; ++c) {
				if (query.c_str()[c] == ';') {
					query_statements.emplace_back(query.substr(next_statement_start, t.start - next_statement_start));
					next_statement_start = tokens[i].start;
				}
			}
			// LCOV_EXCL_STOP
		}
	}
	query_statements.emplace_back(query.substr(next_statement_start, query.size() - next_statement_start));
	return query_statements;
}